

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

optional<pbrt::SquareMatrix<3>_> * __thiscall
pbrt::PixelSensor::SolveXYZFromSensorRGB
          (optional<pbrt::SquareMatrix<3>_> *__return_storage_ptr__,PixelSensor *this,
          SpectrumHandle *sensorIllum,SpectrumHandle *outputIllum)

{
  DenselySampledSpectrum *pDVar1;
  DenselySampledSpectrum *pDVar2;
  DenselySampledSpectrum *pDVar3;
  optional<pbrt::SquareMatrix<3>_> *poVar4;
  int c;
  long lVar5;
  Float *pFVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  uint uVar18;
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [60];
  undefined1 auVar19 [64];
  Float FVar21;
  undefined1 in_ZMM4 [64];
  RGB RVar22;
  XYZ XVar23;
  Float xyzOutput [24] [3];
  Float rgbCamera [24] [3];
  DispatchSplit<6> local_30d;
  float local_30c;
  PixelSensor *local_308;
  float local_300;
  Float local_2fc;
  SpectrumHandle *local_2f8;
  ulong local_2f0;
  ulong local_2e8;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2e0;
  SpectrumHandle local_2d8;
  SpectrumHandle local_2d0;
  optional<pbrt::SquareMatrix<3>_> *local_2c8;
  SpectrumHandle *local_2c0;
  SpectrumHandle local_2b8;
  SpectrumHandle local_2b0;
  SpectrumHandle local_2a8;
  SpectrumHandle local_2a0;
  SpectrumHandle local_298;
  SpectrumHandle local_290;
  SpectrumHandle local_288;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_280;
  ulong local_278 [36];
  Float local_158 [74];
  undefined1 auVar16 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar20 = in_ZMM1._4_60_;
  auVar17 = in_ZMM0._8_56_;
  local_280.bits =
       (outputIllum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_308 = this;
  local_2f8 = sensorIllum;
  local_2c8 = __return_storage_ptr__;
  local_2c0 = outputIllum;
  RVar22 = IlluminantToSensorRGB(this,(SpectrumHandle *)&local_280);
  auVar19._0_4_ = RVar22.b;
  auVar19._4_60_ = auVar20;
  auVar13._0_8_ = RVar22._0_8_;
  auVar13._8_56_ = auVar17;
  if (DAT_03050630 != swatchReflectances) {
    pDVar1 = &local_308->r_bar;
    pDVar2 = &local_308->g_bar;
    pDVar3 = &local_308->b_bar;
    pFVar6 = local_158;
    uVar9 = 0;
    do {
      auVar20 = auVar19._4_60_;
      auVar17 = auVar13._8_56_;
      local_2d0.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                *)(swatchReflectances + uVar9 * 8);
      local_2d8.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(local_2f8->
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                ).bits;
      local_298.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 )((ulong)pDVar3 | 0x2000000000000);
      local_290.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 )((ulong)pDVar2 | 0x2000000000000);
      local_288.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 )((ulong)pDVar1 | 0x2000000000000);
      RVar22 = ProjectReflectance<pbrt::RGB>(&local_2d0,&local_2d8,&local_288,&local_290,&local_298)
      ;
      auVar19._0_4_ = RVar22.b;
      auVar19._4_60_ = auVar20;
      auVar13._0_8_ = RVar22._0_8_;
      auVar13._8_56_ = auVar17;
      auVar12 = vmovshdup_avx(auVar13._0_16_);
      lVar5 = 0;
      do {
        FVar21 = RVar22.r;
        if (((int)lVar5 != 0) && (FVar21 = auVar12._0_4_, (int)lVar5 != 1)) {
          FVar21 = auVar19._0_4_;
        }
        pFVar6[lVar5] = FVar21;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      uVar9 = uVar9 + 1;
      pFVar6 = pFVar6 + 3;
    } while (uVar9 < (ulong)(DAT_03050630 - swatchReflectances >> 3));
  }
  local_2e8 = (local_2f8->
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              ).bits;
  uVar9 = (ulong)&local_308->g_bar | 0x2000000000000;
  local_2f0 = local_2e8 >> 0x30;
  uVar18 = 0;
  iVar7 = 0x168;
  do {
    auVar12._0_4_ = (float)iVar7;
    auVar12._4_12_ = in_ZMM4._4_12_;
    local_278[0] = local_2e8;
    local_30c = auVar12._0_4_;
    local_300 = auVar12._0_4_;
    local_308._0_4_ = (float)uVar18;
    local_2fc = detail::DispatchSplit<6>::operator()
                          (auVar12._0_8_,auVar19._0_8_,&local_30d,&local_30c,local_278,local_2f0);
    local_30c = local_300;
    local_278[0] = uVar9;
    auVar14._0_4_ =
         detail::DispatchSplit<6>::operator()(&local_30d,&local_30c,local_278,uVar9 >> 0x30);
    auVar14._4_60_ = extraout_var;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)local_308._0_4_),auVar14._0_16_,ZEXT416((uint)local_2fc)
                             );
    auVar19 = ZEXT1664(auVar12);
    uVar18 = auVar12._0_4_;
    local_308 = (PixelSensor *)CONCAT44(local_308._4_4_,uVar18);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x33f);
  local_2f0 = (local_2f8->
              super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
              ).bits;
  uVar8 = Spectra::y | 0x2000000000000;
  uVar9 = local_2f0 >> 0x30;
  auVar12 = ZEXT816(0) << 0x40;
  iVar7 = 0x168;
  puVar10 = local_278;
  local_2f8 = (SpectrumHandle *)uVar8;
  do {
    local_2fc = auVar12._0_4_;
    local_30c = (float)iVar7;
    local_2e8 = CONCAT44(local_2e8._4_4_,local_30c);
    local_278[0] = local_2f0;
    local_300 = detail::DispatchSplit<6>::operator()(&local_30d,&local_30c,puVar10,uVar9);
    local_30c = (float)local_2e8;
    local_278[0] = (ulong)local_2f8;
    auVar15._0_4_ =
         detail::DispatchSplit<6>::operator()(&local_30d,&local_30c,puVar10,uVar8 >> 0x30);
    auVar15._4_60_ = extraout_var_00;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)local_2fc),auVar15._0_16_,ZEXT416((uint)local_300));
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x33f);
  if (DAT_03050630 == swatchReflectances) {
    uVar9 = 0;
  }
  else {
    fVar11 = auVar12._0_4_ / 106.856895;
    auVar16 = ZEXT1664(CONCAT124(auVar12._4_12_,fVar11));
    uVar8 = 0;
    local_308 = (PixelSensor *)CONCAT44(local_308._4_4_,fVar11 / (local_308._0_4_ / 106.856895));
    do {
      auVar17 = auVar16._8_56_;
      local_2a0.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                *)(swatchReflectances + uVar8 * 8);
      local_2e0.bits =
           (local_2c0->
           super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           ).bits;
      local_2a8.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(Spectra::x | 0x2000000000000);
      local_2b0.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(Spectra::y | 0x2000000000000);
      local_2b8.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(Spectra::z | 0x2000000000000);
      XVar23 = ProjectReflectance<pbrt::XYZ>
                         (&local_2a0,(SpectrumHandle *)&local_2e0,&local_2a8,&local_2b0,&local_2b8);
      auVar16._0_8_ = XVar23._0_8_;
      auVar16._8_56_ = auVar17;
      auVar12 = vmovshdup_avx(auVar16._0_16_);
      lVar5 = 0;
      do {
        fVar11 = XVar23.X;
        if (((int)lVar5 != 0) && (fVar11 = auVar12._0_4_, (int)lVar5 != 1)) {
          fVar11 = XVar23.Z;
        }
        *(float *)((long)puVar10 + lVar5 * 4) = local_308._0_4_ * fVar11;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      uVar8 = uVar8 + 1;
      uVar9 = DAT_03050630 - swatchReflectances >> 3;
      puVar10 = (ulong *)((long)puVar10 + 0xc);
    } while (uVar8 < uVar9);
  }
  poVar4 = local_2c8;
  LinearLeastSquares(local_2c8,(Float (*) [3])local_158,(Float (*) [3])local_278,(int)uVar9);
  return poVar4;
}

Assistant:

pstd::optional<SquareMatrix<3>> PixelSensor::SolveXYZFromSensorRGB(
    SpectrumHandle sensorIllum, SpectrumHandle outputIllum) const {
    Float rgbCamera[24][3], xyzOutput[24][3];
    // Compute _rgbCamera_ values for training swatches
    RGB outputWhite = IlluminantToSensorRGB(outputIllum);
    for (size_t i = 0; i < swatchReflectances.size(); ++i) {
        RGB rgb = ProjectReflectance<RGB>(swatchReflectances[i], sensorIllum, &r_bar,
                                          &g_bar, &b_bar);
        for (int c = 0; c < 3; ++c)
            rgbCamera[i][c] = rgb[c];
    }

    // Compute _xyzOutput_ values for training swatches
    Float sensorWhiteG = InnerProduct(sensorIllum, &g_bar);
    Float sensorWhiteY = InnerProduct(sensorIllum, &Spectra::Y());
    for (size_t i = 0; i < swatchReflectances.size(); ++i) {
        SpectrumHandle s = swatchReflectances[i];
        XYZ xyz = ProjectReflectance<XYZ>(s, outputIllum, &Spectra::X(), &Spectra::Y(),
                                          &Spectra::Z()) *
                  (sensorWhiteY / sensorWhiteG);
        for (int c = 0; c < 3; ++c)
            xyzOutput[i][c] = xyz[c];
    }

    return LinearLeastSquares(rgbCamera, xyzOutput, swatchReflectances.size());
}